

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfuturewatcher.cpp
# Opt level: O1

void __thiscall
QFutureWatcherBasePrivate::sendCallOutEvent
          (QFutureWatcherBasePrivate *this,QFutureCallOutEvent *event)

{
  QAtomicInt *pQVar1;
  int iVar2;
  QObject *sender;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  int i;
  long in_FS_OFFSET;
  int local_60;
  undefined1 local_5c [36];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (ResultsReady < event->callOutType) goto LAB_003dce13;
  sender = (this->super_QObjectPrivate).super_QObjectData.q_ptr;
  switch(event->callOutType) {
  case Started:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      iVar4 = 0;
      goto LAB_003dcc7f;
    }
    goto LAB_003dce32;
  case Finished:
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_003dce32;
    iVar4 = 1;
    goto LAB_003dcc7f;
  case Canceled:
    (this->pendingResultsReady).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i = 0;
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_003dce32;
    iVar4 = 2;
LAB_003dcc7f:
    QMetaObject::activate(sender,&QFutureWatcherBase::staticMetaObject,iVar4,(void **)0x0);
    return;
  case Suspending:
    iVar4 = (*sender->_vptr_QObject[0xd])(sender);
    bVar3 = QFutureInterfaceBase::isCanceled
                      ((QFutureInterfaceBase *)CONCAT44(extraout_var_00,iVar4));
    if (!bVar3) {
      QMetaObject::activate(sender,&QFutureWatcherBase::staticMetaObject,4,(void **)0x0);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_003dce32;
      iVar4 = 3;
      goto LAB_003dcc7f;
    }
    break;
  case Suspended:
    iVar4 = (*sender->_vptr_QObject[0xd])(sender);
    bVar3 = QFutureInterfaceBase::isCanceled((QFutureInterfaceBase *)CONCAT44(extraout_var,iVar4));
    if (!bVar3) {
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_003dce32;
      iVar4 = 5;
      goto LAB_003dcc7f;
    }
    break;
  case Resumed:
    iVar4 = (*sender->_vptr_QObject[0xd])(sender);
    bVar3 = QFutureInterfaceBase::isCanceled
                      ((QFutureInterfaceBase *)CONCAT44(extraout_var_01,iVar4));
    if (!bVar3) {
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_003dce32;
      iVar4 = 6;
      goto LAB_003dcc7f;
    }
    break;
  case Progress:
    iVar4 = (*sender->_vptr_QObject[0xd])(sender);
    bVar3 = QFutureInterfaceBase::isCanceled
                      ((QFutureInterfaceBase *)CONCAT44(extraout_var_02,iVar4));
    if (!bVar3) {
      local_5c._0_4_ = event->index1;
      local_5c._12_8_ = local_5c;
      local_5c._4_8_ = 0;
      QMetaObject::activate(sender,&QFutureWatcherBase::staticMetaObject,10,(void **)(local_5c + 4))
      ;
      if ((event->text).d.ptr != (char16_t *)0x0) {
        local_5c._12_8_ = &event->text;
        iVar4 = 0xb;
        goto LAB_003dcd1e;
      }
    }
    break;
  case ProgressRange:
    local_5c._0_4_ = event->index1;
    local_60 = event->index2;
    local_5c._12_8_ = local_5c;
    local_5c._20_8_ = &local_60;
    iVar4 = 9;
LAB_003dcd1e:
    local_5c._4_8_ = 0;
    QMetaObject::activate
              (sender,&QFutureWatcherBase::staticMetaObject,iVar4,(void **)(local_5c + 4));
    break;
  case ResultsReady:
    iVar4 = (*sender->_vptr_QObject[0xd])(sender);
    bVar3 = QFutureInterfaceBase::isCanceled
                      ((QFutureInterfaceBase *)CONCAT44(extraout_var_03,iVar4));
    if (!bVar3) {
      LOCK();
      pQVar1 = &this->pendingResultsReady;
      iVar4 = (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
              super___atomic_base<int>._M_i;
      (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (iVar4 <= this->maximumPendingResultsReady) {
        iVar4 = (*sender->_vptr_QObject[0xd])(sender);
        QFutureInterfaceBase::setThrottled
                  ((QFutureInterfaceBase *)CONCAT44(extraout_var_04,iVar4),false);
      }
      iVar4 = event->index1;
      iVar2 = event->index2;
      local_5c._20_8_ = &local_60;
      local_5c._4_8_ = 0;
      local_60 = iVar2;
      local_5c._0_4_ = iVar4;
      local_5c._12_8_ = (QString *)local_5c;
      QMetaObject::activate(sender,&QFutureWatcherBase::staticMetaObject,8,(void **)(local_5c + 4));
      if (iVar4 < iVar2 &&
          0 < (this->resultAtConnected).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
              _q_value.super___atomic_base<int>._M_i) {
        do {
          local_5c._4_8_ = 0;
          local_5c._0_4_ = iVar4;
          local_5c._12_8_ = (QString *)local_5c;
          QMetaObject::activate
                    (sender,&QFutureWatcherBase::staticMetaObject,7,(void **)(local_5c + 4));
          iVar4 = iVar4 + 1;
        } while (iVar2 != iVar4);
      }
    }
  }
LAB_003dce13:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_003dce32:
  __stack_chk_fail();
}

Assistant:

void QFutureWatcherBasePrivate::sendCallOutEvent(QFutureCallOutEvent *event)
{
    Q_Q(QFutureWatcherBase);

    switch (event->callOutType) {
        case QFutureCallOutEvent::Started:
            emit q->started();
        break;
        case QFutureCallOutEvent::Finished:
            emit q->finished();
        break;
        case QFutureCallOutEvent::Canceled:
            pendingResultsReady.storeRelaxed(0);
            emit q->canceled();
        break;
        case QFutureCallOutEvent::Suspending:
            if (q->futureInterface().isCanceled())
                break;
            emit q->suspending();
#if QT_DEPRECATED_SINCE(6, 0)
QT_WARNING_PUSH
QT_WARNING_DISABLE_DEPRECATED
            emit q->paused();
QT_WARNING_POP
#endif
        break;
        case QFutureCallOutEvent::Suspended:
            if (q->futureInterface().isCanceled())
                break;
            emit q->suspended();
        break;
        case QFutureCallOutEvent::Resumed:
            if (q->futureInterface().isCanceled())
                break;
            emit q->resumed();
        break;
        case QFutureCallOutEvent::ResultsReady: {
            if (q->futureInterface().isCanceled())
                break;

            if (pendingResultsReady.fetchAndAddRelaxed(-1) <= maximumPendingResultsReady)
                q->futureInterface().setThrottled(false);

            const int beginIndex = event->index1;
            const int endIndex = event->index2;

            emit q->resultsReadyAt(beginIndex, endIndex);

            if (resultAtConnected.loadRelaxed() <= 0)
                break;

            for (int i = beginIndex; i < endIndex; ++i)
                emit q->resultReadyAt(i);

        } break;
        case QFutureCallOutEvent::Progress:
            if (q->futureInterface().isCanceled())
                break;

            emit q->progressValueChanged(event->index1);
            if (!event->text.isNull()) // ###
                emit q->progressTextChanged(event->text);
        break;
        case QFutureCallOutEvent::ProgressRange:
            emit q->progressRangeChanged(event->index1, event->index2);
        break;
        default: break;
    }
}